

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

void Wln_RetAddToMoves(Wln_Ret_t *p,Vec_Int_t *vSet,int Delay,int fForward,int nMoves,
                      int fSkipSimple,int fVerbose)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  uint local_58;
  uint local_4c;
  int NameId;
  int iObj;
  int i;
  int fSkipSimple_local;
  int nMoves_local;
  int fForward_local;
  int Delay_local;
  Vec_Int_t *vSet_local;
  Wln_Ret_t *p_local;
  
  if (vSet == (Vec_Int_t *)0x0) {
    printf("Move %4d : Recording initial state     (delay = %6d)\n",(ulong)(uint)nMoves,
           (ulong)(uint)Delay);
    Vec_IntPushTwo(&p->vMoves,Delay,0);
  }
  else {
    pcVar3 = "backward";
    if (fForward != 0) {
      pcVar3 = "forward ";
    }
    printf("Move %4d : Recording %s retiming (delay = %6d) :",(ulong)(uint)nMoves,pcVar3,
           (ulong)(uint)Delay);
    Vec_IntPush(&p->vMoves,Delay);
    for (NameId = 0; iVar1 = Vec_IntSize(vSet), NameId < iVar1; NameId = NameId + 1) {
      uVar2 = Vec_IntEntry(vSet,NameId);
      local_58 = Vec_IntEntry(&p->pNtk->vNameIds,uVar2);
      if ((fSkipSimple == 0) ||
         (((iVar1 = Wln_ObjIsFf(p->pNtk,uVar2), iVar1 == 0 &&
           (iVar1 = Wln_ObjType(p->pNtk,uVar2), iVar1 != 0x5b)) &&
          (iVar1 = Wln_ObjType(p->pNtk,uVar2), iVar1 != 0x5c)))) {
        local_4c = local_58;
        if (fForward != 0) {
          local_4c = -local_58;
        }
        Vec_IntPush(&p->vMoves,local_4c);
        if (fVerbose != 0) {
          if (fForward != 0) {
            uVar2 = -uVar2;
            local_58 = -local_58;
          }
          printf(" %d (NameID = %d)  ",(ulong)uVar2,(ulong)local_58);
        }
      }
    }
    Vec_IntPush(&p->vMoves,0);
    if (fVerbose == 0) {
      uVar2 = Vec_IntSize(vSet);
      printf(" %3d retimed objects",(ulong)uVar2);
    }
    printf("\n");
  }
  return;
}

Assistant:

void Wln_RetAddToMoves( Wln_Ret_t * p, Vec_Int_t * vSet, int Delay, int fForward, int nMoves, int fSkipSimple, int fVerbose )
{
    int i, iObj;
    if ( vSet == NULL )
    {
        printf( "Move %4d : Recording initial state     (delay = %6d)\n", nMoves, Delay );
        Vec_IntPushTwo( &p->vMoves, Delay, 0 );
        return;
    }
    printf( "Move %4d : Recording %s retiming (delay = %6d) :", nMoves, fForward ? "forward " : "backward", Delay );
    Vec_IntPush( &p->vMoves, Delay );
    Vec_IntForEachEntry( vSet, iObj, i )
    {
        int NameId = Vec_IntEntry( &p->pNtk->vNameIds, iObj );
        if ( fSkipSimple && (Wln_ObjIsFf(p->pNtk, iObj) || Wln_ObjType(p->pNtk, iObj) == ABC_OPER_SLICE || Wln_ObjType(p->pNtk, iObj) == ABC_OPER_CONCAT) )
            continue;
        Vec_IntPush( &p->vMoves, fForward ? -NameId : NameId );
        if ( fVerbose )
            printf( " %d (NameID = %d)  ", fForward ? -iObj : iObj, fForward ? -NameId : NameId );
    }
    Vec_IntPush( &p->vMoves, 0 );
    if ( !fVerbose )
        printf( " %3d retimed objects", Vec_IntSize(vSet) );
    printf( "\n" );
}